

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O0

ares_status_t
ares_init_sysconfig_files
          (ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_bool_t process_resolvconf)

{
  ares_status_t aVar1;
  char *local_30;
  ares_status_t local_20;
  ares_status_t status;
  ares_bool_t process_resolvconf_local;
  ares_sysconfig_t *sysconfig_local;
  ares_channel_t *channel_local;
  
  if (process_resolvconf != ARES_FALSE) {
    if (channel->resolvconf_path == (char *)0x0) {
      local_30 = "/etc/resolv.conf";
    }
    else {
      local_30 = channel->resolvconf_path;
    }
    aVar1 = process_config_lines(channel,local_30,sysconfig,ares_sysconfig_parse_resolv_line);
    if ((aVar1 != ARES_SUCCESS) && (aVar1 != ARES_ENOTFOUND)) {
      return aVar1;
    }
  }
  local_20 = process_config_lines(channel,"/etc/nsswitch.conf",sysconfig,parse_nsswitch_line);
  if ((((local_20 == ARES_SUCCESS) || (local_20 == ARES_ENOTFOUND)) &&
      ((local_20 = process_config_lines(channel,"/etc/netsvc.conf",sysconfig,parse_svcconf_line),
       local_20 == ARES_SUCCESS || (local_20 == ARES_ENOTFOUND)))) &&
     ((local_20 = process_config_lines(channel,"/etc/svc.conf",sysconfig,parse_svcconf_line),
      local_20 == ARES_SUCCESS || (local_20 == ARES_ENOTFOUND)))) {
    local_20 = ARES_SUCCESS;
  }
  return local_20;
}

Assistant:

ares_status_t ares_init_sysconfig_files(const ares_channel_t *channel,
                                        ares_sysconfig_t     *sysconfig,
                                        ares_bool_t process_resolvconf)
{
  ares_status_t status = ARES_SUCCESS;

  /* Resolv.conf */
  if (process_resolvconf) {
    status = process_config_lines(channel,
                                  (channel->resolvconf_path != NULL)
                                    ? channel->resolvconf_path
                                    : PATH_RESOLV_CONF,
                                  sysconfig, ares_sysconfig_parse_resolv_line);
    if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
      goto done;
    }
  }

  /* Nsswitch.conf */
  status = process_config_lines(channel, "/etc/nsswitch.conf", sysconfig,
                                parse_nsswitch_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  /* netsvc.conf */
  status = process_config_lines(channel, "/etc/netsvc.conf", sysconfig,
                                parse_svcconf_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  /* svc.conf */
  status = process_config_lines(channel, "/etc/svc.conf", sysconfig,
                                parse_svcconf_line);
  if (status != ARES_SUCCESS && status != ARES_ENOTFOUND) {
    goto done;
  }

  status = ARES_SUCCESS;

done:
  return status;
}